

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O1

void jpeg_mem_dest(j_compress_ptr cinfo,uchar **outbuffer,unsigned_long *outsize)

{
  jpeg_error_mgr *pjVar1;
  _func_boolean_j_compress_ptr *p_Var2;
  jpeg_destination_mgr *pjVar3;
  _func_void_j_compress_ptr *p_Var4;
  
  if (outbuffer == (uchar **)0x0 || outsize == (unsigned_long *)0x0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x18;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->dest == (jpeg_destination_mgr *)0x0) {
    pjVar3 = (jpeg_destination_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x50);
    cinfo->dest = pjVar3;
  }
  pjVar3 = cinfo->dest;
  pjVar3->init_destination = init_mem_destination;
  pjVar3->empty_output_buffer = empty_mem_output_buffer;
  pjVar3->term_destination = term_mem_destination;
  pjVar3[1].next_output_byte = (JOCTET *)outbuffer;
  pjVar3[1].free_in_buffer = (size_t)outsize;
  pjVar3[1].init_destination = (_func_void_j_compress_ptr *)0x0;
  if ((*outbuffer == (uchar *)0x0) || (*outsize == 0)) {
    p_Var4 = (_func_void_j_compress_ptr *)malloc(0x1000);
    *outbuffer = (uchar *)p_Var4;
    pjVar3[1].init_destination = p_Var4;
    if (p_Var4 == (_func_void_j_compress_ptr *)0x0) {
      *(undefined8 *)&cinfo->err->msg_code = 0xa00000038;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    *outsize = 0x1000;
  }
  p_Var2 = (_func_boolean_j_compress_ptr *)*outbuffer;
  pjVar3[1].empty_output_buffer = p_Var2;
  pjVar3->next_output_byte = (JOCTET *)p_Var2;
  p_Var4 = (_func_void_j_compress_ptr *)*outsize;
  pjVar3[1].term_destination = p_Var4;
  pjVar3->free_in_buffer = (size_t)p_Var4;
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_dest (j_compress_ptr cinfo,
	       unsigned char ** outbuffer, unsigned long * outsize)
{
  my_mem_dest_ptr dest;

  if (outbuffer == NULL || outsize == NULL)	/* sanity check */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same buffer without re-executing jpeg_mem_dest.
   */
  if (cinfo->dest == NULL) {	/* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				  SIZEOF(my_mem_destination_mgr));
  }

  dest = (my_mem_dest_ptr) cinfo->dest;
  dest->pub.init_destination = init_mem_destination;
  dest->pub.empty_output_buffer = empty_mem_output_buffer;
  dest->pub.term_destination = term_mem_destination;
  dest->outbuffer = outbuffer;
  dest->outsize = outsize;
  dest->newbuffer = NULL;

  if (*outbuffer == NULL || *outsize == 0) {
    /* Allocate initial buffer */
    dest->newbuffer = *outbuffer = (unsigned char *) malloc(OUTPUT_BUF_SIZE);
    if (dest->newbuffer == NULL)
      ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 10);
    *outsize = OUTPUT_BUF_SIZE;
  }

  dest->pub.next_output_byte = dest->buffer = *outbuffer;
  dest->pub.free_in_buffer = dest->bufsize = *outsize;
}